

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O2

void SourceElements_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  undefined8 *puVar1;
  JsAstNode *pJVar2;
  
  res->type = JS_COMPLETION;
  (res->u).completion.type = JS_COMPLETION_NORMAL;
  (res->u).number = 0.0;
  pJVar2 = na + 1;
  do {
    puVar1 = *(undefined8 **)pJVar2;
    if (puVar1 == (undefined8 *)0x0) {
      return;
    }
    (*JsNodeClassEval[((JsAstNode *)*puVar1)->astClass])((JsAstNode *)*puVar1,context,res);
    pJVar2 = (JsAstNode *)(puVar1 + 1);
  } while ((res->u).completion.type == JS_COMPLETION_NORMAL);
  return;
}

Assistant:

static void
SourceElements_eval(na, context, res)
	struct JsAstNode *na; /* (struct SourceElements_node) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstSourceElementsNode *n = CAST_NODE(na, JsAstSourceElementsNode);
	struct JsAstSourceElement *e;

	/*
	 * NB: strictly, this should 'evaluate' the
	 * FunctionDeclarations, but they only yield <NORMAL, NULL, NULL>
	 * so, we don't. We just run the non-functiondecl statements
	 * instead. It has the same result.
	 */
	JS_SET_COMPLETION(res,JS_COMPLETION_NORMAL, NULL);
	for (e = n->statements; e; e = e->next) {
		EVAL(e->node, context, res);
		if (res->u.completion.type != JS_COMPLETION_NORMAL)
			break;
	}
}